

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

string_view __thiscall
slang::ast::ElabSystemTaskSymbol::createMessage
          (ElabSystemTaskSymbol *this,ASTContext *context,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> args)

{
  bool bVar1;
  SourceLocation SVar2;
  Scope *this_00;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  size_t size;
  byte *__str;
  void *__src;
  size_t __n;
  size_type __len;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_R8;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  string_view sVar6;
  byte *mem;
  undefined1 local_288 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> str;
  undefined1 local_258 [8];
  EvalContext evalCtx;
  Compilation *comp;
  ASTContext *context_local;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> args_local;
  char *local_10;
  undefined1 auVar7 [16];
  
  args_local.data_ = args.data_;
  context_local = context;
  bVar1 = FmtHelpers::checkDisplayArgs((ASTContext *)this,(Args *)&context_local);
  if (!bVar1) {
    bVar5 = sv("",0);
    auVar7._0_8_ = bVar5._M_len;
    auVar7._8_8_ = bVar5._M_str;
    return (string_view)auVar7;
  }
  SVar2 = (SourceLocation)ASTContext::getCompilation((ASTContext *)this);
  str.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._39_1_ = 0;
  evalCtx.disableRange.endLoc = SVar2;
  bitmask<slang::ast::EvalFlags>::bitmask
            ((bitmask<slang::ast::EvalFlags> *)
             &str.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0x27);
  EvalContext::EvalContext
            ((EvalContext *)local_258,(Compilation *)SVar2,
             (bitmask<slang::ast::EvalFlags>)
             str.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._39_1_);
  this_00 = not_null<const_slang::ast::Scope_*>::operator*
                      ((not_null<const_slang::ast::Scope_*> *)this);
  FmtHelpers::formatDisplay_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_288,(FmtHelpers *)this_00,(Scope *)local_258,(EvalContext *)&context_local,
             in_R8);
  EvalContext::reportDiags((EvalContext *)local_258,(ASTContext *)this);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_288);
  if (bVar1) {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_288);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pbVar4 = std::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_288);
      std::__cxx11::string::insert((ulong)pbVar4,(char *)0x0);
      SVar2 = evalCtx.disableRange.endLoc;
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_288);
      size = std::__cxx11::string::size();
      __str = BumpAllocator::allocate((BumpAllocator *)SVar2,size,1);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_288);
      __src = (void *)std::__cxx11::string::data();
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_288);
      __n = std::__cxx11::string::size();
      memcpy(__str,__src,__n);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_288);
      __len = std::__cxx11::string::size();
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&args_local.size_,(char *)__str
                 ,__len);
      goto LAB_002d05b8;
    }
  }
  join_0x00000010_0x00000000_ = sv("",0);
LAB_002d05b8:
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_288);
  EvalContext::~EvalContext((EvalContext *)local_258);
  sVar6._M_len = args_local.size_;
  sVar6._M_str = local_10;
  return sVar6;
}

Assistant:

string_view ElabSystemTaskSymbol::createMessage(const ASTContext& context,
                                                span<const Expression* const> args) {
    // Check all arguments.
    if (!FmtHelpers::checkDisplayArgs(context, args))
        return ""sv;

    // Format the message to string.
    auto& comp = context.getCompilation();
    EvalContext evalCtx(comp);
    std::optional<std::string> str = FmtHelpers::formatDisplay(*context.scope, evalCtx, args);
    evalCtx.reportDiags(context);

    if (!str || str->empty())
        return ""sv;

    str->insert(0, ": ");

    // Copy the string into permanent memory.
    auto mem = comp.allocate(str->size(), alignof(char));
    memcpy(mem, str->data(), str->size());

    return string_view(reinterpret_cast<char*>(mem), str->size());
}